

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

CVmNetFile *
CVmObjFile::get_filename_and_access
          (vm_rcdesc *rc,int *access,int is_resource_file,os_filetype_t file_type,char *mime_type)

{
  int32_t iVar1;
  CVmNetFile *pCVar2;
  int in_EDX;
  int *in_RSI;
  vm_val_t *in_R8;
  char *in_stack_000010e0;
  os_filetype_t in_stack_000010ec;
  int in_stack_000010f0;
  int in_stack_000010f4;
  vm_rcdesc *in_stack_000010f8;
  vm_val_t *in_stack_00001100;
  
  if (in_EDX == 0) {
    if (*in_RSI == 0) {
      CVmStack::get(1);
      iVar1 = vm_val_t::num_to_int(in_R8);
      *in_RSI = iVar1;
      if (4 < *in_RSI) {
        err_throw(0);
      }
    }
  }
  else {
    *in_RSI = 1;
  }
  CVmStack::get(0);
  pCVar2 = get_filename_arg(in_stack_00001100,in_stack_000010f8,in_stack_000010f4,in_stack_000010f0,
                            in_stack_000010ec,in_stack_000010e0);
  return pCVar2;
}

Assistant:

CVmNetFile *CVmObjFile::get_filename_and_access(
    VMG_ const vm_rcdesc *rc, int *access, int is_resource_file,
    os_filetype_t file_type, const char *mime_type)
{
    /*
     *   If it's a resource file, the access mode is always READ, and there's
     *   no access mode argument.  If the caller provided a non-zero access
     *   mode, there's also no argument - we just use the caller's mode.  If
     *   the caller specified zero as the mode, it means we have to read the
     *   mode from an extra integer argument.  
     */
    if (is_resource_file)
    {
        /* resource file - the only access mode possible is READ */
        *access = VMOBJFILE_ACCESS_READ;
    }
    else if (*access == 0)
    {
        /* get the access mode from the stack */
        *access = G_stk->get(1)->num_to_int(vmg0_);

        /* make sure it's within the valid range for bytecode access codes */
        if (*access > VMOBJFILE_ACCESS_USERMAX)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* get the filename from the first argument */
    return get_filename_arg(
        vmg_ G_stk->get(0), rc, *access, is_resource_file,
        file_type, mime_type);
}